

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O2

void __thiscall
Js::JavascriptPromiseThunkFinallyFunction::JavascriptPromiseThunkFinallyFunction
          (JavascriptPromiseThunkFinallyFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          Var value,bool shouldThrow)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01370228;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->value,value);
  this->shouldThrow = shouldThrow;
  return;
}

Assistant:

JavascriptPromiseThunkFinallyFunction(DynamicType* type, FunctionInfo* functionInfo, Var value, bool shouldThrow)
            : RuntimeFunction(type, functionInfo), value(value), shouldThrow(shouldThrow)
        { }